

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O1

void release_pending_output_frames(aom_codec_alg_priv_t *ctx)

{
  pthread_mutex_t *__mutex;
  long lVar1;
  int *piVar2;
  ulong uVar3;
  int *piVar4;
  aom_codec_frame_buffer_t *paVar5;
  
  if (ctx->frame_worker != (AVxWorker *)0x0) {
    __mutex = (pthread_mutex_t *)ctx->buffer_pool;
    pthread_mutex_lock(__mutex);
    lVar1 = *ctx->frame_worker->data1;
    if (*(long *)(lVar1 + 0x58d78) != 0) {
      uVar3 = 0;
      do {
        piVar2 = *(int **)(lVar1 + 0x58d58 + uVar3 * 8);
        if (((piVar2 != (int *)0x0) && (*piVar2 = *piVar2 + -1, *piVar2 == 0)) &&
           (*(long *)(piVar2 + 0x132) != 0)) {
          piVar4 = piVar2 + 0x132;
          (**(code **)((long)__mutex + 0x38))(__mutex[1].__align,piVar4);
          piVar4[0] = 0;
          piVar4[1] = 0;
          piVar2[0x134] = 0;
          piVar2[0x135] = 0;
          piVar2[0x136] = 0;
          piVar2[0x137] = 0;
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < *(ulong *)(lVar1 + 0x58d78));
    }
    *(undefined8 *)(lVar1 + 0x58d78) = 0;
    pthread_mutex_unlock(__mutex);
    if (ctx->num_grain_image_frame_buffers != 0) {
      paVar5 = ctx->grain_image_frame_buffers;
      uVar3 = 0;
      do {
        (**(code **)((long)__mutex + 0x38))(__mutex[1].__align,paVar5);
        uVar3 = uVar3 + 1;
        paVar5->data = (uint8_t *)0x0;
        paVar5->size = 0;
        paVar5->priv = (void *)0x0;
        paVar5 = paVar5 + 1;
      } while (uVar3 < ctx->num_grain_image_frame_buffers);
    }
    ctx->num_grain_image_frame_buffers = 0;
  }
  return;
}

Assistant:

static void release_pending_output_frames(aom_codec_alg_priv_t *ctx) {
  // Release any pending output frames from the previous decoder_decode or
  // decoder_inspect call. We need to do this even if the decoder is being
  // flushed or the input arguments are invalid.
  if (ctx->frame_worker) {
    BufferPool *const pool = ctx->buffer_pool;
    lock_buffer_pool(pool);
    AVxWorker *const worker = ctx->frame_worker;
    FrameWorkerData *const frame_worker_data = (FrameWorkerData *)worker->data1;
    struct AV1Decoder *pbi = frame_worker_data->pbi;
    for (size_t j = 0; j < pbi->num_output_frames; j++) {
      decrease_ref_count(pbi->output_frames[j], pool);
    }
    pbi->num_output_frames = 0;
    unlock_buffer_pool(pool);
    for (size_t j = 0; j < ctx->num_grain_image_frame_buffers; j++) {
      pool->release_fb_cb(pool->cb_priv, &ctx->grain_image_frame_buffers[j]);
      ctx->grain_image_frame_buffers[j].data = NULL;
      ctx->grain_image_frame_buffers[j].size = 0;
      ctx->grain_image_frame_buffers[j].priv = NULL;
    }
    ctx->num_grain_image_frame_buffers = 0;
  }
}